

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Array<unsigned_char> * __thiscall
kj::ReadableFile::readAllBytes(Array<unsigned_char> *__return_storage_ptr__,ReadableFile *this)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  ArrayPtr<unsigned_char> content;
  Array<unsigned_char> local_90;
  ArrayPtr<unsigned_char> local_68;
  size_t local_58;
  size_t n;
  size_t local_48;
  undefined1 local_19;
  ReadableFile *local_18;
  ReadableFile *this_local;
  Array<unsigned_char> *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (ReadableFile *)__return_storage_ptr__;
  (*(this->super_FsNode)._vptr_FsNode[2])(&n);
  heapArray<unsigned_char>(__return_storage_ptr__,local_48);
  local_68 = Array<unsigned_char>::asBytes(__return_storage_ptr__);
  iVar1 = (*(this->super_FsNode)._vptr_FsNode[6])(this,0,local_68.ptr,local_68.size_);
  local_58 = CONCAT44(extraout_var,iVar1);
  sVar2 = Array<unsigned_char>::size(__return_storage_ptr__);
  if (CONCAT44(extraout_var,iVar1) < sVar2) {
    content = Array<unsigned_char>::first(__return_storage_ptr__,local_58);
    heapArray<unsigned_char>(&local_90,content);
    Array<unsigned_char>::operator=(__return_storage_ptr__,&local_90);
    Array<unsigned_char>::~Array(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Array<byte> ReadableFile::readAllBytes() const {
  Array<byte> result = heapArray<byte>(stat().size);
  size_t n = read(0, result.asBytes());
  if (n < result.size()) {
    // Apparently file was truncated concurrently. Reduce to new size to match.
    result = heapArray(result.first(n));
  }
  return result;
}